

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::initReplyFromPushPromise
          (QHttp2ProtocolHandler *this,HttpMessagePair *message,QUrl *cacheKey)

{
  bool bVar1;
  State SVar2;
  QHttp2Stream *this_00;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QHttp2Stream *in_stack_00000028;
  bool streamEnded;
  qsizetype i;
  HttpHeader *headers;
  bool replyFinished;
  QHttp2Stream *promise;
  QByteDataBuffer downloadBuffer;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QHttp2Stream *in_stack_fffffffffffffef8;
  QHttp2Stream *pQVar4;
  QHttp2Stream *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QHttp2Stream *in_stack_ffffffffffffff10;
  QDebug *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff48;
  QHttp2Stream *pQVar5;
  undefined8 local_68;
  HttpMessagePair *in_stack_ffffffffffffffa0;
  QHttp2ProtocolHandler *in_stack_ffffffffffffffa8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QHttp2Connection::promisedStream
                      ((QHttp2Connection *)
                       CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       (QUrl *)in_stack_ffffffffffffff00);
  QHttpNetworkReply::setHttp2WasUsed
            ((QHttpNetworkReply *)in_stack_ffffffffffffff00,
             SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::QT_HTTP2();
  anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff00,
             (QLoggingCategory *)in_stack_fffffffffffffef8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2d19e7);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff10,
               (char *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(char *)in_stack_fffffffffffffef8,
               (char *)0x2d1a00);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff48);
    QHttp2Stream::streamID((QHttp2Stream *)this_00);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,
                       (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  SVar2 = QHttp2Stream::state((QHttp2Stream *)this_00);
  connectStream(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_00000028);
  memset(&local_68,0,0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QHttp2Stream::takeDownloadBuffer(in_stack_ffffffffffffff10);
  QHttp2Stream::receivedHeaders(in_stack_fffffffffffffef8);
  bVar1 = std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::empty
                    ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  if (!bVar1) {
    if (SVar2 == Closed) {
      QByteDataBuffer::isEmpty((QByteDataBuffer *)0x2d1b72);
    }
    QHttp2Stream::headersReceived
              (in_stack_ffffffffffffff00,(HttpHeader *)in_stack_fffffffffffffef8,
               (bool)in_stack_ffffffffffffff0f);
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector
            ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
             in_stack_ffffffffffffff10);
  bVar1 = QByteDataBuffer::isEmpty((QByteDataBuffer *)0x2d1ba9);
  if (!bVar1) {
    pQVar5 = (QHttp2Stream *)0x0;
    while (pQVar4 = pQVar5, qVar3 = QByteDataBuffer::bufferCount((QByteDataBuffer *)0x2d1bd1),
          (long)pQVar5 < qVar3) {
      bVar1 = false;
      pQVar5 = pQVar4;
      if (SVar2 == Closed) {
        qVar3 = QByteDataBuffer::bufferCount((QByteDataBuffer *)0x2d1c06);
        bVar1 = pQVar4 == (QHttp2Stream *)(qVar3 + -1);
        in_stack_ffffffffffffff00 = pQVar4;
      }
      pQVar4 = this_00;
      QByteDataBuffer::operator[]((QByteDataBuffer *)in_stack_ffffffffffffff00,(qsizetype)this_00);
      QHttp2Stream::dataReceived(in_stack_ffffffffffffff00,(QByteArray *)pQVar4,bVar1);
      pQVar5 = (QHttp2Stream *)&pQVar5->field_0x1;
    }
  }
  QByteDataBuffer::~QByteDataBuffer((QByteDataBuffer *)0x2d1c78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2ProtocolHandler::initReplyFromPushPromise(const HttpMessagePair &message,
                                                     const QUrl &cacheKey)
{
    QHttp2Stream *promise = h2Connection->promisedStream(cacheKey);
    Q_ASSERT(promise);
    Q_ASSERT(message.second);
    message.second->setHttp2WasUsed(true);

    qCDebug(QT_HTTP2) << "found cached/promised response on stream" << promise->streamID();

    const bool replyFinished = promise->state() == QHttp2Stream::State::Closed;

    connectStream(message, promise);

    // Now that we have connect()ed, re-emit signals so that the reply
    // can be processed as usual:

    QByteDataBuffer downloadBuffer = promise->takeDownloadBuffer();
    if (const auto &headers = promise->receivedHeaders(); !headers.empty())
        emit promise->headersReceived(headers, replyFinished && downloadBuffer.isEmpty());

    if (!downloadBuffer.isEmpty()) {
        for (qsizetype i = 0; i < downloadBuffer.bufferCount(); ++i) {
            const bool streamEnded = replyFinished && i == downloadBuffer.bufferCount() - 1;
            emit promise->dataReceived(downloadBuffer[i], streamEnded);
        }
    }
}